

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst.c
# Opt level: O0

int64_t get_pixel_proj_error
                  (uint8_t *src8,int width,int height,int src_stride,uint8_t *dat8,int dat_stride,
                  int use_highbitdepth,int32_t *flt0,int flt0_stride,int32_t *flt1,int flt1_stride,
                  int *xqd,sgr_params_type *params)

{
  int in_ECX;
  int in_EDX;
  int in_ESI;
  uint8_t *in_RDI;
  uint8_t *in_R8;
  int in_R9D;
  int in_stack_00000008;
  int32_t *in_stack_00000010;
  int in_stack_00000018;
  int32_t *in_stack_00000020;
  int in_stack_00000028;
  int *in_stack_00000030;
  int xq [2];
  int local_54 [2];
  int local_4c;
  uint8_t *local_48;
  int local_3c;
  int local_38;
  int local_34;
  uint8_t *local_30;
  int64_t local_28;
  
  local_4c = in_R9D;
  local_48 = in_R8;
  local_3c = in_ECX;
  local_38 = in_EDX;
  local_34 = in_ESI;
  local_30 = in_RDI;
  av1_decode_xq(in_stack_00000030,local_54,(sgr_params_type *)CONCAT44(dat_stride,xq[1]));
  if (in_stack_00000008 == 0) {
    local_28 = (*av1_lowbd_pixel_proj_error)
                         (local_30,local_34,local_38,local_3c,local_48,local_4c,in_stack_00000010,
                          in_stack_00000018,in_stack_00000020,in_stack_00000028,local_54,
                          (sgr_params_type *)CONCAT44(dat_stride,xq[1]));
  }
  else {
    local_28 = (*av1_highbd_pixel_proj_error)
                         (local_30,local_34,local_38,local_3c,local_48,local_4c,in_stack_00000010,
                          in_stack_00000018,in_stack_00000020,in_stack_00000028,local_54,
                          (sgr_params_type *)CONCAT44(dat_stride,xq[1]));
  }
  return local_28;
}

Assistant:

static int64_t get_pixel_proj_error(const uint8_t *src8, int width, int height,
                                    int src_stride, const uint8_t *dat8,
                                    int dat_stride, int use_highbitdepth,
                                    int32_t *flt0, int flt0_stride,
                                    int32_t *flt1, int flt1_stride, int *xqd,
                                    const sgr_params_type *params) {
  int xq[2];
  av1_decode_xq(xqd, xq, params);

#if CONFIG_AV1_HIGHBITDEPTH
  if (use_highbitdepth) {
    return av1_highbd_pixel_proj_error(src8, width, height, src_stride, dat8,
                                       dat_stride, flt0, flt0_stride, flt1,
                                       flt1_stride, xq, params);

  } else {
    return av1_lowbd_pixel_proj_error(src8, width, height, src_stride, dat8,
                                      dat_stride, flt0, flt0_stride, flt1,
                                      flt1_stride, xq, params);
  }
#else
  (void)use_highbitdepth;
  return av1_lowbd_pixel_proj_error(src8, width, height, src_stride, dat8,
                                    dat_stride, flt0, flt0_stride, flt1,
                                    flt1_stride, xq, params);
#endif
}